

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  UdpOutputPortDeclSyntax *pUVar2;
  Token TVar3;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  EqualsValueClauseSyntax *in_stack_ffffffffffffffa0;
  Info *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  TVar3 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = TVar3.info;
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x80))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x80))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x80))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x80))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::EqualsValueClauseSyntax>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  pUVar2 = BumpAllocator::
           emplace<slang::syntax::UdpOutputPortDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::EqualsValueClauseSyntax*>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (Token *)__child_stack,(EqualsValueClauseSyntax **)args_4);
  return (int)pUVar2;
}

Assistant:

static SyntaxNode* clone(const UdpOutputPortDeclSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<UdpOutputPortDeclSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.reg.deepClone(alloc),
        node.name.deepClone(alloc),
        node.initializer ? deepClone(*node.initializer, alloc) : nullptr
    );
}